

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O3

void __thiscall
xmrig::Workers<xmrig::CpuLaunchData>::start
          (Workers<xmrig::CpuLaunchData> *this,
          vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *data)

{
  pointer *pppTVar1;
  pointer pCVar2;
  iterator __position;
  IBackend *pIVar3;
  pointer ppTVar4;
  Thread<xmrig::CpuLaunchData> *pTVar5;
  int64_t iVar6;
  Miner *pMVar7;
  bool bVar8;
  bool bVar9;
  undefined2 uVar10;
  int iVar11;
  undefined4 uVar12;
  Hashrate *this_00;
  pointer ppTVar13;
  CpuLaunchData *item;
  pointer pCVar14;
  Thread<xmrig::CpuLaunchData> *local_48;
  Thread<xmrig::CpuLaunchData> *local_40;
  thread local_38;
  
  pCVar2 = (data->super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar14 = (data->
                 super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar2; pCVar14 = pCVar14 + 1)
  {
    local_48 = (Thread<xmrig::CpuLaunchData> *)operator_new(0x48);
    __position._M_current =
         (this->m_workers).
         super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pIVar3 = this->d_ptr->backend;
    local_48->m_id =
         (long)__position._M_current -
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar8 = pCVar14->hugePages;
    bVar9 = pCVar14->hwAES;
    uVar10 = *(undefined2 *)&pCVar14->field_0x6;
    iVar11 = pCVar14->priority;
    uVar12 = *(undefined4 *)&pCVar14->field_0xc;
    iVar6 = pCVar14->affinity;
    pMVar7 = pCVar14->miner;
    (local_48->m_config).assembly = (Assembly)(pCVar14->assembly).m_id;
    (local_48->m_config).hugePages = bVar8;
    (local_48->m_config).hwAES = bVar9;
    *(undefined2 *)&(local_48->m_config).field_0x6 = uVar10;
    (local_48->m_config).priority = iVar11;
    *(undefined4 *)&(local_48->m_config).field_0xc = uVar12;
    (local_48->m_config).affinity = iVar6;
    (local_48->m_config).miner = pMVar7;
    uVar12 = *(undefined4 *)&pCVar14->field_0x24;
    (local_48->m_config).intensity = pCVar14->intensity;
    *(undefined4 *)&(local_48->m_config).field_0x24 = uVar12;
    local_48->m_backend = pIVar3;
    local_48->m_worker = (IWorker *)0x0;
    (local_48->m_thread)._M_id._M_thread = 0;
    if (__position._M_current ==
        (this->m_workers).
        super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<xmrig::Thread<xmrig::CpuLaunchData>*,std::allocator<xmrig::Thread<xmrig::CpuLaunchData>*>>
      ::_M_realloc_insert<xmrig::Thread<xmrig::CpuLaunchData>*>
                ((vector<xmrig::Thread<xmrig::CpuLaunchData>*,std::allocator<xmrig::Thread<xmrig::CpuLaunchData>*>>
                  *)this,__position,&local_48);
    }
    else {
      *__position._M_current = local_48;
      pppTVar1 = &(this->m_workers).
                  super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  this_00 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_00,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_00;
  LOCK();
  Nonce::m_sequence = Nonce::m_sequence + 1;
  UNLOCK();
  ppTVar13 = (this->m_workers).
             super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar4 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar13 != ppTVar4) {
    do {
      pTVar5 = *ppTVar13;
      local_48 = (Thread<xmrig::CpuLaunchData> *)onReady;
      local_40 = pTVar5;
      std::thread::thread<void(*&)(void*),xmrig::Thread<xmrig::CpuLaunchData>*,void>
                (&local_38,(_func_void_void_ptr **)&local_48,&local_40);
      if ((pTVar5->m_thread)._M_id._M_thread != 0) {
        std::terminate();
      }
      (pTVar5->m_thread)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
      ppTVar13 = ppTVar13 + 1;
    } while (ppTVar13 != ppTVar4);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}